

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

unrecognized_param * __thiscall
boost::runtime::
specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>::operator<<
          (specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
           *this,char *val)

{
  unrecognized_param *in_RSI;
  unrecognized_param *in_RDI;
  
  std::__cxx11::string::append
            ((char *)&(in_RSI->
                      super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
                      ).super_input_error.super_param_error.msg);
  unrecognized_param::unrecognized_param(in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }